

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

int http_open(HTTP_INFO *hi,char *url)

{
  BOOL verify;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int https;
  int opt;
  char port [10];
  socklen_t slen;
  char host [256];
  char dir [1024];
  uint local_540;
  int local_53c;
  char local_536 [10];
  socklen_t local_52c;
  char local_528 [256];
  char local_428 [1024];
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  verify = (hi->tls).verify;
  parse_url(url,(int *)&local_540,local_528,local_536,local_428);
  uVar1 = local_540;
  iVar3 = (hi->tls).ssl_fd.fd;
  if (iVar3 == -1) {
LAB_00111b7f:
  }
  else {
    if (((local_540 != (hi->url).https) || (iVar2 = strcmp((hi->url).host,local_528), iVar2 != 0))
       || (iVar2 = strcmp((hi->url).port,local_536), iVar2 != 0)) {
      if (iVar3 != -1) {
        https_close(hi);
      }
      goto LAB_00111b7f;
    }
    local_52c = 4;
    iVar3 = getsockopt(iVar3,1,4,&local_53c,&local_52c);
    if ((-1 < iVar3) && (local_53c < 1)) goto LAB_00111ba6;
    https_close(hi);
    local_540._0_1_ = (BOOL)uVar1;
  }
  https_init(hi,(BOOL)local_540,verify);
  iVar3 = https_connect(hi,local_528,local_536);
  if (iVar3 < 0) {
    https_close(hi);
    _error = iVar3;
    return -1;
  }
LAB_00111ba6:
  sVar4 = strlen(local_528);
  strncpy((hi->url).host,local_528,sVar4);
  sVar4 = strlen(local_536);
  strncpy((hi->url).port,local_536,sVar4);
  sVar4 = strlen(local_428);
  strncpy((hi->url).path,local_428,sVar4);
  return 0;
}

Assistant:

int http_open(HTTP_INFO *hi, char *url)
{
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt;
    socklen_t   slen;


    if (NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if ((hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0))
    {
        if (hi->tls.ssl_fd.fd != -1)
            https_close(hi);

        https_init(hi, https, verify);

        if ((ret = https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            _error = ret;

            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if ((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *) &opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if ((ret = https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                _error = ret;

                return -1;
            }
        }
//      else
//          printf("socket reuse: %d \n", sock_fd);
    }

    strncpy(hi->url.host, host, strlen(host));
    strncpy(hi->url.port, port, strlen(port));
    strncpy(hi->url.path, dir, strlen(dir));

    return 0;
}